

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

void __thiscall
lzham::search_accelerator::search_accelerator
          (search_accelerator *this,lzham_malloc_context malloc_context)

{
  lzham_malloc_context in_RSI;
  undefined8 *in_RDI;
  uint i;
  lzham_malloc_context in_stack_ffffffffffffff58;
  vector<unsigned_int> *in_stack_ffffffffffffff60;
  vector<unsigned_int> *local_68;
  uint local_20;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 6),in_RSI);
  vector<unsigned_int>::vector((vector<unsigned_int> *)(in_RDI + 9),in_RSI);
  vector<lzham::node>::vector((vector<lzham::node> *)(in_RDI + 0xc),in_RSI);
  vector<lzham::dict_match>::vector((vector<lzham::dict_match> *)(in_RDI + 0xf),in_RSI);
  vector<long>::vector((vector<long> *)(in_RDI + 0x12),in_RSI);
  vector<unsigned_int>::vector((vector<unsigned_int> *)(in_RDI + 0x15),in_RSI);
  vector<unsigned_int>::vector((vector<unsigned_int> *)(in_RDI + 0x18),in_RSI);
  local_68 = (vector<unsigned_int> *)(in_RDI + 0x1b);
  do {
    vector<unsigned_int>::vector(local_68,(lzham_malloc_context)0x0);
    local_68 = local_68 + 1;
  } while (local_68 != (vector<unsigned_int> *)(in_RDI + 0x7b));
  *(undefined4 *)(in_RDI + 0x7b) = 0;
  *(undefined4 *)((long)in_RDI + 0x3dc) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)((long)in_RDI + 0x3e4) = 0;
  *(undefined4 *)(in_RDI + 0x7d) = 0;
  *(undefined1 *)((long)in_RDI + 0x3ec) = 0;
  *(undefined1 *)((long)in_RDI + 0x3ed) = 0;
  *(undefined1 *)((long)in_RDI + 0x3ee) = 0;
  *(undefined1 *)((long)in_RDI + 0x3ef) = 0;
  in_RDI[0x7e] = 0;
  in_RDI[0x7f] = 0;
  for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
    vector<unsigned_int>::set_malloc_context(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

search_accelerator::search_accelerator(lzham_malloc_context malloc_context) :
      m_malloc_context(malloc_context),
      m_pLZBase(NULL),
      m_pTask_pool(NULL),
      m_max_helper_threads(0),
      m_max_dict_size(0),
      m_max_dict_size_mask(0),
      m_lookahead_pos(0),
      m_lookahead_size(0),
      m_cur_dict_size(0),
      m_dict(malloc_context), 
      m_hash(malloc_context), 
      m_nodes(malloc_context), 
      m_matches(malloc_context), 
      m_match_refs(malloc_context), 
      m_digram_hash(malloc_context),
      m_digram_next(malloc_context),
      m_fill_lookahead_pos(0),
      m_fill_lookahead_size(0),
      m_fill_dict_size(0),
      m_max_probes(0),
      m_max_matches(0),
      m_all_matches(false),
      m_deterministic(false),
      m_len2_matches(false),
      m_hash24(false),
      m_next_match_ref(0),
      m_num_completed_helper_threads(0)
   {
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_thread_dict_offsets); i++)
         m_thread_dict_offsets[i].set_malloc_context(malloc_context);
   }